

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadStartSection(BinaryReader *this,Offset section_size)

{
  bool bVar1;
  Result RVar2;
  Index local_28;
  Enum local_24;
  Index func_index;
  Offset section_size_local;
  BinaryReader *this_local;
  
  _func_index = section_size;
  section_size_local = (Offset)this;
  local_24 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x2f])(this->delegate_,section_size);
  bVar1 = Succeeded((Result)local_24);
  if (bVar1) {
    RVar2 = ReadIndex(this,&local_28,"start function index");
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x30])();
      bVar1 = Succeeded(RVar2);
      if (bVar1) {
        RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x31])();
        bVar1 = Succeeded(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
        else {
          PrintError(this,"EndStartSection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"OnStartFunction callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
  }
  else {
    PrintError(this,"BeginStartSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadStartSection(Offset section_size) {
  CALLBACK(BeginStartSection, section_size);
  Index func_index;
  CHECK_RESULT(ReadIndex(&func_index, "start function index"));
  CALLBACK(OnStartFunction, func_index);
  CALLBACK0(EndStartSection);
  return Result::Ok;
}